

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::ConstructorOp::evaluate(ConstructorOp *this,ExecutionContext *evalCtx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference ppEVar4;
  undefined4 extraout_var;
  VariableType *this_00;
  reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
  local_a0;
  ConstStridedValueAccess<64> local_98;
  ExecConstValueAccess local_88;
  int local_74;
  undefined1 auStack_70 [4];
  int elemNdx;
  ExecConstValueAccess src;
  undefined1 local_58 [8];
  reverse_iterator i_1;
  undefined1 auStack_48 [4];
  int curScalarNdx;
  ExecValueAccess dst;
  VariableType *type;
  undefined1 local_28 [16];
  reverse_iterator i;
  ExecutionContext *evalCtx_local;
  ConstructorOp *this_local;
  
  i.current._M_current =
       (__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>
        )(__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>
          )evalCtx;
  std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::rbegin
            ((vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_> *)(local_28 + 8));
  while( true ) {
    std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::rend
              ((vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_> *)local_28);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                             *)(local_28 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                             *)local_28);
    if (!bVar1) break;
    ppEVar4 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                           *)(local_28 + 8));
    (*(*ppEVar4)->_vptr_Expression[4])(*ppEVar4,i.current._M_current);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                  *)&type,(int)local_28 + 8);
  }
  dst.super_ConstStridedValueAccess<64>.m_value = (Scalar *)ValueRange::getType(&this->m_valueRange)
  ;
  ValueStorage<64>::setStorage
            (&this->m_value,(VariableType *)dst.super_ConstStridedValueAccess<64>.m_value);
  _auStack_48 = (ConstStridedValueAccess<64>)
                ValueStorage<64>::getValue
                          (&this->m_value,
                           (VariableType *)dst.super_ConstStridedValueAccess<64>.m_value);
  i_1.current._M_current._4_4_ = 0;
  std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::rbegin
            ((vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_> *)local_58);
  while( true ) {
    std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::rend
              ((vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_> *)&src.m_value);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                             *)local_58,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                             *)&src.m_value);
    if (!bVar1) break;
    ppEVar4 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                           *)local_58);
    iVar2 = (*(*ppEVar4)->_vptr_Expression[5])();
    _auStack_70 = (VariableType *)CONCAT44(extraout_var,iVar2);
    local_74 = 0;
    while( true ) {
      iVar2 = local_74;
      this_00 = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)auStack_70);
      iVar3 = VariableType::getNumElements(this_00);
      if (iVar3 <= iVar2) break;
      local_88 = ConstStridedValueAccess<64>::component
                           ((ConstStridedValueAccess<64> *)auStack_70,local_74);
      iVar2 = i_1.current._M_current._4_4_;
      i_1.current._M_current._4_4_ = i_1.current._M_current._4_4_ + 1;
      local_98 = (ConstStridedValueAccess<64>)
                 StridedValueAccess<64>::component((StridedValueAccess<64> *)auStack_48,iVar2);
      rsg::anon_unknown_0::convertExecValue(local_88,(ExecValueAccess)local_98);
      local_74 = local_74 + 1;
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
    ::operator++(&local_a0,(int)local_58);
  }
  return;
}

Assistant:

void ConstructorOp::evaluate (ExecutionContext& evalCtx)
{
	// Evaluate children
	for (vector<Expression*>::reverse_iterator i = m_inputExpressions.rbegin(); i != m_inputExpressions.rend(); i++)
		(*i)->evaluate(evalCtx);

	// Compute value
	const VariableType& type = m_valueRange.getType();
	m_value.setStorage(type);

	ExecValueAccess	dst				= m_value.getValue(type);
	int				curScalarNdx	= 0;

	for (vector<Expression*>::reverse_iterator i = m_inputExpressions.rbegin(); i != m_inputExpressions.rend(); i++)
	{
		ExecConstValueAccess src = (*i)->getValue();

		for (int elemNdx = 0; elemNdx < src.getType().getNumElements(); elemNdx++)
			convertExecValue(src.component(elemNdx), dst.component(curScalarNdx++));
	}
}